

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmtable.cpp
# Opt level: O3

void __thiscall
icu_63::Formattable::Formattable(Formattable *this,Formattable *arrayToCopy,int32_t count)

{
  Formattable *pFVar1;
  
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__Formattable_003ed8d8;
  (this->fBogus).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003febe0;
  (this->fBogus).fUnion.fStackFields.fLengthAndFlags = 2;
  (this->fValue).fObject = (UObject *)0x0;
  this->fType = kLong;
  this->fDecimalStr = (CharString *)0x0;
  this->fDecimalQuantity = (DecimalQuantity *)0x0;
  UnicodeString::setToBogus(&this->fBogus);
  this->fType = kArray;
  pFVar1 = createArrayCopy(arrayToCopy,count);
  (this->fValue).fArrayAndCount.fArray = pFVar1;
  (this->fValue).fArrayAndCount.fCount = count;
  return;
}

Assistant:

Formattable::Formattable(const Formattable* arrayToCopy, int32_t count)
    :   UObject(), fType(kArray)
{
    init();
    fType = kArray;
    fValue.fArrayAndCount.fArray = createArrayCopy(arrayToCopy, count);
    fValue.fArrayAndCount.fCount = count;
}